

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_tlm_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  OPJ_UINT32 l_Ptlm_size;
  OPJ_UINT32 l_quotient;
  OPJ_UINT32 l_tot_num_tp_remaining;
  OPJ_UINT32 l_tot_num_tp;
  OPJ_UINT32 l_SP;
  OPJ_UINT32 l_ST;
  OPJ_UINT32 l_Stlm;
  OPJ_UINT32 l_Ztlm;
  uint local_30;
  OPJ_UINT32 local_2c;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  if (in_EDX < 2) {
    opj_event_msg_v2(in_RCX,1,"Error reading TLM marker\n");
    local_4 = 0;
  }
  else {
    local_1c = in_EDX - 2;
    local_28 = in_RCX;
    local_18 = in_RSI;
    opj_read_bytes_LE(in_RSI,&local_2c,1);
    local_18 = local_18 + 1;
    opj_read_bytes_LE(local_18,&local_30,1);
    local_18 = local_18 + 1;
    if (local_1c % (((local_30 >> 6 & 1) + 1) * 2 + (local_30 >> 4 & 3)) == 0) {
      local_4 = 1;
    }
    else {
      opj_event_msg_v2(local_28,1,"Error reading TLM marker\n");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_tlm_v2 (
						opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_Ztlm, l_Stlm, l_ST, l_SP, l_tot_num_tp, l_tot_num_tp_remaining, l_quotient, l_Ptlm_size;
	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	if (p_header_size < 2) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading TLM marker\n");
		return OPJ_FALSE;
	}
	p_header_size -= 2;

	opj_read_bytes(p_header_data,&l_Ztlm,1);				/* Ztlm */
	++p_header_data;
	opj_read_bytes(p_header_data,&l_Stlm,1);				/* Stlm */
	++p_header_data;

	l_ST = ((l_Stlm >> 4) & 0x3);
	l_SP = (l_Stlm >> 6) & 0x1;

	l_Ptlm_size = (l_SP + 1) * 2;
	l_quotient = l_Ptlm_size + l_ST;

	l_tot_num_tp = p_header_size / l_quotient;
	l_tot_num_tp_remaining = p_header_size % l_quotient;

	if (l_tot_num_tp_remaining != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading TLM marker\n");
		return OPJ_FALSE;
	}
	/* FIXME Do not care of this at the moment since only local variables are set here */
	/*
	for
		(i = 0; i < l_tot_num_tp; ++i)
	{
		opj_read_bytes(p_header_data,&l_Ttlm_i,l_ST);				// Ttlm_i
		p_header_data += l_ST;
		opj_read_bytes(p_header_data,&l_Ptlm_i,l_Ptlm_size);		// Ptlm_i
		p_header_data += l_Ptlm_size;
	}*/
	return OPJ_TRUE;
}